

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

pair<const_void_*,_int> __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
FindSymbol(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *name)

{
  bool bVar1;
  iterator iVar2;
  void *pvVar3;
  ulong uVar4;
  pair<const_void_*,_int> pVar5;
  
  iVar2 = FindLastLessOrEqual(this,name);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->by_symbol_)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = IsSubSymbol(this,(string *)(iVar2._M_node + 1),name);
    if (bVar1) {
      pvVar3 = *(void **)(iVar2._M_node + 2);
      uVar4 = (ulong)*(uint *)&iVar2._M_node[2]._M_parent;
      goto LAB_001fee38;
    }
  }
  pvVar3 = (void *)0x0;
  uVar4 = 0;
LAB_001fee38:
  pVar5._8_8_ = uVar4;
  pVar5.first = pvVar3;
  return pVar5;
}

Assistant:

Value SimpleDescriptorDatabase::DescriptorIndex<Value>::FindSymbol(
    const string& name) {
  typename map<string, Value>::iterator iter = FindLastLessOrEqual(name);

  return (iter != by_symbol_.end() && IsSubSymbol(iter->first, name)) ?
         iter->second : Value();
}